

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int jx9Builtin_strglob(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  int iVar1;
  u8 *zPattern;
  u8 *zString;
  anon_union_8_3_18420de5_for_x aVar2;
  jx9_value *pObj;
  
  if (((nArg < 2) || (((*apArg)->iFlags & 1) == 0)) || ((apArg[1]->iFlags & 1) == 0)) {
    pObj = pCtx->pRet;
    jx9MemObjRelease(pObj);
    (pObj->x).rVal = 0.0;
  }
  else {
    zPattern = (u8 *)jx9_value_to_string(*apArg,(int *)0x0);
    zString = (u8 *)jx9_value_to_string(apArg[1],(int *)0x0);
    iVar1 = patternCompare(zPattern,zString,0x5c,0);
    pObj = pCtx->pRet;
    jx9MemObjRelease(pObj);
    aVar2.iVal._1_7_ = 0;
    aVar2.iVal._0_1_ = iVar1 != 0;
    pObj->x = aVar2;
  }
  pObj->iFlags = pObj->iFlags & 0xfffffe90U | 8;
  return 0;
}

Assistant:

static int jx9Builtin_strglob(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *zString, *zPattern;
	int iEsc = '\\';
	int rc;
	if( nArg < 2 || !jx9_value_is_string(apArg[0]) || !jx9_value_is_string(apArg[1]) ){
		/* Missing/Invalid arguments, return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Extract the pattern and the string */
	zPattern  = jx9_value_to_string(apArg[0], 0);
	zString = jx9_value_to_string(apArg[1], 0);
	/* Go globbing */
	rc = Glob((const unsigned char *)zPattern, (const unsigned char *)zString, iEsc, 0);
	/* Globbing result */
	jx9_result_bool(pCtx, rc);
	return JX9_OK;
}